

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acquisition.c
# Opt level: O2

int katherine_acquisition_begin
              (katherine_acquisition_t *acq,katherine_config_t *config,char readout_mode,
              katherine_acquisition_mode_t acq_mode,_Bool fast_vco_enabled,_Bool decode_data)

{
  int iVar1;
  time_t tVar2;
  undefined7 in_register_00000011;
  
  acq->acq_mode = (char)acq_mode;
  acq->readout_mode = readout_mode;
  acq->fast_vco_enabled = fast_vco_enabled;
  acq->decode_data = decode_data;
  if ((readout_mode == '\x01') && (1 < config->no_frames)) {
    iVar1 = 0x16;
  }
  else {
    iVar1 = katherine_configure(acq->device,config);
    if (iVar1 == 0) {
      iVar1 = katherine_set_seq_readout_start
                        (acq->device,(int)CONCAT71(in_register_00000011,readout_mode));
      if (iVar1 == 0) {
        iVar1 = katherine_set_acq_mode(acq->device,acq_mode,fast_vco_enabled);
        if (iVar1 == 0) {
          acq->state = '\x01';
          acq->completed_frames = 0;
          acq->requested_frames = config->no_frames;
          acq->requested_frame_duration = config->acq_time / 1000000000.0;
          acq->dropped_measurement_data = 0;
          acq->last_toa_offset = 0;
          acq->pixel_buffer_valid = 0;
          acq->pixel_buffer_max_valid = 0;
          iVar1 = katherine_udp_mutex_lock(&acq->device->control_socket);
          if (iVar1 == 0) {
            tVar2 = time((time_t *)0x0);
            acq->acq_start_time = tVar2;
            iVar1 = katherine_cmd6_long(&acq->device->control_socket,'\x03',(long)readout_mode);
            katherine_udp_mutex_unlock(&acq->device->control_socket);
          }
        }
      }
    }
  }
  return iVar1;
}

Assistant:

int
katherine_acquisition_begin(katherine_acquisition_t *acq, const katherine_config_t *config, char readout_mode, katherine_acquisition_mode_t acq_mode, bool fast_vco_enabled, bool decode_data)
{
    int res = 0;

    acq->acq_mode = acq_mode;
    acq->readout_mode = readout_mode;
    acq->fast_vco_enabled = fast_vco_enabled;
    acq->decode_data = decode_data;

#if KATHERINE_DEBUG_ACQ > 0
    dump_config(acq, config);
#endif /* KATHERINE_DEBUG_ACQ */

    if (readout_mode == READOUT_DATA_DRIVEN && config->no_frames > 1) {
        res = EINVAL;
        goto err;
    }

    res = katherine_configure(acq->device, config);
    if (res) goto err;

    res = katherine_set_seq_readout_start(acq->device, readout_mode);
    if (res) goto err;

    res = katherine_set_acq_mode(acq->device, acq_mode, fast_vco_enabled);
    if (res) goto err;

    acq->state = ACQUISITION_RUNNING;

    acq->completed_frames = 0;
    acq->requested_frames = config->no_frames;
    acq->requested_frame_duration = config->acq_time / 1e9;
    acq->dropped_measurement_data = 0;

    acq->pixel_buffer_valid = 0;
    acq->pixel_buffer_max_valid = 0;
    acq->last_toa_offset = 0;

    res = katherine_udp_mutex_lock(&acq->device->control_socket);
    if (res) goto err;

    acq->acq_start_time = time(NULL);

    res = katherine_cmd_start_acquisition(&acq->device->control_socket, readout_mode);
    if (res) goto err_cmd;

    (void) katherine_udp_mutex_unlock(&acq->device->control_socket);
    return 0;

err_cmd:
    (void) katherine_udp_mutex_unlock(&acq->device->control_socket);
err:
    return res;
}